

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool duckdb::BitpackingAnalyze<duckdb::uhugeint_t>(AnalyzeState *state,Vector *input,idx_t count)

{
  bool bVar1;
  BitpackingAnalyzeState<duckdb::uhugeint_t> *pBVar2;
  LogicalType *this;
  idx_t iVar3;
  idx_t iVar4;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  idx_t idx;
  idx_t i;
  uhugeint_t *data;
  UnifiedVectorFormat vdata;
  idx_t type_size;
  BitpackingAnalyzeState<duckdb::uhugeint_t> *analyze_state;
  UnifiedVectorFormat *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined8 in_stack_ffffffffffffff68;
  PhysicalType type;
  UnifiedVectorFormat *idx_00;
  SelectionVector *local_78;
  undefined1 in_stack_ffffffffffffff97;
  BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *in_stack_ffffffffffffff98;
  uhugeint_t in_stack_ffffffffffffffa0;
  bool local_1;
  
  type = (PhysicalType)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  pBVar2 = AnalyzeState::Cast<duckdb::BitpackingAnalyzeState<duckdb::uhugeint_t>>
                     ((AnalyzeState *)in_stack_ffffffffffffff20);
  this = Vector::GetType(in_RSI);
  LogicalType::InternalType(this);
  iVar3 = GetTypeIdSize(type);
  iVar4 = CompressionInfo::GetBlockSize((CompressionInfo *)0xaa0c2e);
  if (iVar4 < iVar3 << 0xc) {
    local_1 = false;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    Vector::ToUnifiedFormat(in_RDI,(idx_t)in_RSI,in_RDX);
    UnifiedVectorFormat::GetData<duckdb::uhugeint_t>((UnifiedVectorFormat *)&local_78);
    for (idx_00 = (UnifiedVectorFormat *)0x0; idx_00 < in_RDX;
        idx_00 = (UnifiedVectorFormat *)((long)&idx_00->sel + 1)) {
      SelectionVector::get_index(local_78,(idx_t)idx_00);
      in_stack_ffffffffffffff20 = (UnifiedVectorFormat *)&pBVar2->state;
      in_stack_ffffffffffffff2f =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     ((TemplatedValidityMask<unsigned_long> *)
                      CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                      (idx_t)in_stack_ffffffffffffff20);
      bVar1 = BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::
              Update<duckdb::EmptyBitpackingWriter>
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
                         (bool)in_stack_ffffffffffffff97);
      if (!bVar1) {
        local_1 = false;
        goto LAB_00aa0d71;
      }
    }
    local_1 = true;
LAB_00aa0d71:
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff20);
  }
  return local_1;
}

Assistant:

bool BitpackingAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &analyze_state = state.Cast<BitpackingAnalyzeState<T>>();

	// We use BITPACKING_METADATA_GROUP_SIZE tuples, which can exceed the block size.
	// In that case, we disable bitpacking.
	// we are conservative here by multiplying by 2
	auto type_size = GetTypeIdSize(input.GetType().InternalType());
	if (type_size * BITPACKING_METADATA_GROUP_SIZE * 2 > state.info.GetBlockSize()) {
		return false;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!analyze_state.state.template Update<EmptyBitpackingWriter>(data[idx], vdata.validity.RowIsValid(idx))) {
			return false;
		}
	}
	return true;
}